

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_function.cpp
# Opt level: O0

Sequence * __thiscall
S_function::operator()(Sequence *__return_storage_ptr__,S_function *this,Sequence *seq)

{
  reference this_00;
  allocator<Sequence> local_129;
  __normal_iterator<Sequence_*,_std::vector<Sequence,_std::allocator<Sequence>_>_> local_128;
  __normal_iterator<Sequence_*,_std::vector<Sequence,_std::allocator<Sequence>_>_> local_120;
  list<Sequence,_std::allocator<Sequence>_> local_118;
  Sequence local_100;
  undefined1 local_a8 [8];
  Sequence subseq;
  int i;
  allocator<Sequence> local_39;
  undefined1 local_38 [8];
  vector<Sequence,_std::allocator<Sequence>_> seqs;
  Sequence *seq_local;
  S_function *this_local;
  
  seqs.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = seq;
  std::allocator<Sequence>::allocator(&local_39);
  std::vector<Sequence,_std::allocator<Sequence>_>::vector
            ((vector<Sequence,_std::allocator<Sequence>_> *)local_38,8,&local_39);
  std::allocator<Sequence>::~allocator(&local_39);
  for (subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node._0_4_ = 0;
      (int)subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_node < 8;
      subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._0_4_ =
           (int)subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node + 1) {
    Sequence::subsequence
              ((Sequence *)local_a8,
               seqs.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (int)subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node * 6,
               (int)subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node * 6 + 6);
    Sbox::operator()(&local_100,
                     this->m_sboxes
                     [7 - (int)subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_node],(Sequence *)local_a8);
    this_00 = std::vector<Sequence,_std::allocator<Sequence>_>::operator[]
                        ((vector<Sequence,_std::allocator<Sequence>_> *)local_38,
                         (long)(7 - (int)subseq.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Deque_impl_data._M_finish._M_node));
    Sequence::operator=(this_00,&local_100);
    Sequence::~Sequence(&local_100);
    Sequence::~Sequence((Sequence *)local_a8);
  }
  local_120._M_current =
       (Sequence *)
       std::vector<Sequence,_std::allocator<Sequence>_>::begin
                 ((vector<Sequence,_std::allocator<Sequence>_> *)local_38);
  local_128._M_current =
       (Sequence *)
       std::vector<Sequence,_std::allocator<Sequence>_>::end
                 ((vector<Sequence,_std::allocator<Sequence>_> *)local_38);
  std::allocator<Sequence>::allocator(&local_129);
  std::__cxx11::list<Sequence,std::allocator<Sequence>>::
  list<__gnu_cxx::__normal_iterator<Sequence*,std::vector<Sequence,std::allocator<Sequence>>>,void>
            ((list<Sequence,std::allocator<Sequence>> *)&local_118,local_120,local_128,&local_129);
  Sequence::Sequence(__return_storage_ptr__,&local_118);
  std::__cxx11::list<Sequence,_std::allocator<Sequence>_>::~list(&local_118);
  std::allocator<Sequence>::~allocator(&local_129);
  std::vector<Sequence,_std::allocator<Sequence>_>::~vector
            ((vector<Sequence,_std::allocator<Sequence>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Sequence S_function::operator()(Sequence &seq) {
    std::vector<Sequence> seqs(8);

    // For each subsequence of size 6, map input to output using Sboxes
    for (auto i = 0; i < 8; ++i) {
        Sequence subseq = seq.subsequence(i * 6, (i + 1) * 6);
        seqs[8 - i - 1] = (*m_sboxes[8 - i - 1])(subseq);
    }

    return Sequence({seqs.begin(), seqs.end()});
}